

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

optional<tinyusdz::Kind> *
tinyusdz::KindFromString(optional<tinyusdz::Kind> *__return_storage_ptr__,string *str)

{
  bool bVar1;
  ulong uVar2;
  Kind local_38 [2];
  Kind local_30 [6];
  string *local_18;
  string *str_local;
  
  local_18 = str;
  str_local = (string *)__return_storage_ptr__;
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str
                            ,"model");
  if (bVar1) {
    local_30[5] = 0;
    nonstd::optional_lite::optional<tinyusdz::Kind>::optional<tinyusdz::Kind,_0>
              (__return_storage_ptr__,local_30 + 5);
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_18,"group");
    if (bVar1) {
      local_30[4] = 1;
      nonstd::optional_lite::optional<tinyusdz::Kind>::optional<tinyusdz::Kind,_0>
                (__return_storage_ptr__,local_30 + 4);
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_18,"assembly");
      if (bVar1) {
        local_30[3] = 2;
        nonstd::optional_lite::optional<tinyusdz::Kind>::optional<tinyusdz::Kind,_0>
                  (__return_storage_ptr__,local_30 + 3);
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_18,"component");
        if (bVar1) {
          local_30[2] = 3;
          nonstd::optional_lite::optional<tinyusdz::Kind>::optional<tinyusdz::Kind,_0>
                    (__return_storage_ptr__,local_30 + 2);
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_18,"subcomponent");
          if (bVar1) {
            local_30[1] = 4;
            nonstd::optional_lite::optional<tinyusdz::Kind>::optional<tinyusdz::Kind,_0>
                      (__return_storage_ptr__,local_30 + 1);
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_18,"sceneLibrary");
            if (bVar1) {
              local_30[0] = SceneLibrary;
              nonstd::optional_lite::optional<tinyusdz::Kind>::optional<tinyusdz::Kind,_0>
                        (__return_storage_ptr__,local_30);
            }
            else {
              uVar2 = ::std::__cxx11::string::empty();
              if ((uVar2 & 1) == 0) {
                local_38[0] = UserDef;
                nonstd::optional_lite::optional<tinyusdz::Kind>::optional<tinyusdz::Kind,_0>
                          (__return_storage_ptr__,local_38);
              }
              else {
                nonstd::optional_lite::optional<tinyusdz::Kind>::optional(__return_storage_ptr__);
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Kind> KindFromString(const std::string &str) {
  if (str == "model") {
    return Kind::Model;
  } else if (str == "group") {
    return Kind::Group;
  } else if (str == "assembly") {
    return Kind::Assembly;
  } else if (str == "component") {
    return Kind::Component;
  } else if (str == "subcomponent") {
    return Kind::Subcomponent;
  } else if (str == "sceneLibrary") {
    // https://developer.apple.com/documentation/arkit/usdz_schemas_for_ar/scenelibrary
    return Kind::SceneLibrary;
  } else if (str.empty()) {
    return nonstd::nullopt;
  } else {
    return Kind::UserDef;
  }
}